

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O0

void cff_size_done(FT_Size cffsize)

{
  FT_Memory memory_00;
  FT_Driver pFVar1;
  undefined8 *P;
  PSH_Globals_Funcs pPVar2;
  int local_44;
  FT_UInt i;
  PSH_Globals_Funcs funcs;
  CFF_Internal internal;
  CFF_Font_conflict font;
  CFF_Face face;
  CFF_Size size;
  FT_Memory memory;
  FT_Size cffsize_local;
  
  memory_00 = cffsize->face->memory;
  pFVar1 = cffsize->face[4].driver;
  P = (undefined8 *)cffsize->internal->module_data;
  if (P != (undefined8 *)0x0) {
    pPVar2 = cff_size_get_globals_funcs((CFF_Size)cffsize);
    if (pPVar2 != (PSH_Globals_Funcs)0x0) {
      (*pPVar2->destroy)((PSH_Globals)*P);
      for (local_44 = *(int *)&pFVar1[0x33].root.library; local_44 != 0; local_44 = local_44 + -1) {
        (*pPVar2->destroy)((PSH_Globals)P[(ulong)(local_44 - 1) + 1]);
      }
    }
    ft_mem_free(memory_00,P);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_size_done( FT_Size  cffsize )        /* CFF_Size */
  {
    FT_Memory     memory   = cffsize->face->memory;
    CFF_Size      size     = (CFF_Size)cffsize;
    CFF_Face      face     = (CFF_Face)size->root.face;
    CFF_Font      font     = (CFF_Font)face->extra.data;
    CFF_Internal  internal = (CFF_Internal)cffsize->internal->module_data;


    if ( internal )
    {
      PSH_Globals_Funcs  funcs;


      funcs = cff_size_get_globals_funcs( size );
      if ( funcs )
      {
        FT_UInt  i;


        funcs->destroy( internal->topfont );

        for ( i = font->num_subfonts; i > 0; i-- )
          funcs->destroy( internal->subfonts[i - 1] );
      }

      FT_FREE( internal );
    }
  }